

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcPropertySet::~IfcPropertySet(IfcPropertySet *this)

{
  ~IfcPropertySet((IfcPropertySet *)
                  &this[-1].super_IfcPropertySetDefinition.super_IfcPropertyDefinition.super_IfcRoot
                   .Name.ptr._M_string_length);
  return;
}

Assistant:

IfcPropertySet() : Object("IfcPropertySet") {}